

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeResumeThrow
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,Name tag,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *labels
          )

{
  undefined8 *puVar1;
  size_t *psVar2;
  _Any_data *__dest;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *handlerTags;
  HeapTypeKind HVar3;
  Tag *pTVar4;
  size_t size;
  ResumeThrow *expr;
  char *pcVar5;
  char *pcVar6;
  _Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *handlerBlocks;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *sentTypes;
  Name name;
  Name tag_00;
  Signature SVar7;
  optional<wasm::HeapType> ct_00;
  ResumeThrow local_1c8;
  undefined1 local_120 [8];
  Result<wasm::ResumeTable> resumetable;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  char *local_a8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_a0;
  undefined1 local_98 [8];
  Result<wasm::ResumeTable> _val;
  _Storage<wasm::HeapType,_true> local_58;
  HeapType ct_local;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pcVar5 = tag.super_IString.str._M_str;
  local_58 = (_Storage<wasm::HeapType,_true>)ct.id;
  if ((long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4 ==
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 3) {
    _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
    super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
    super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
    super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
    super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
    super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = tag.super_IString.str._M_len
    ;
    HVar3 = HeapType::getKind(&local_58._M_value);
    if (HVar3 == Cont) {
      local_1c8.handlerTags.allocator = &this->wasm->allocator;
      local_1c8.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression._id =
           ResumeThrowId;
      local_1c8.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression.type.id = 0;
      local_1c8.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           (Name *)0x0;
      local_1c8.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
           = 0;
      local_1c8.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements = 0;
      local_1c8.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           (Name *)0x0;
      local_1c8.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      usedElements = 0;
      local_1c8.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements = 0;
      local_1c8.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      local_1c8.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      local_1c8.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      local_1c8.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data =
           (Type *)0x0;
      local_1c8.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements =
           0;
      local_1c8.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.
      allocatedElements = 0;
      local_1c8.tag.super_IString.str._M_len =
           _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
      name.super_IString.str._M_str = pcVar5;
      name.super_IString.str._M_len =
           _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
      local_1c8.tag.super_IString.str._M_str = pcVar5;
      local_1c8.handlerBlocks.allocator = local_1c8.handlerTags.allocator;
      local_1c8.operands.allocator = local_1c8.handlerTags.allocator;
      local_1c8.sentTypes.allocator = local_1c8.handlerTags.allocator;
      local_a8 = pcVar5;
      local_a0 = tags;
      pTVar4 = Module::getTag(this->wasm,name);
      SVar7 = HeapType::getSignature(&pTVar4->type);
      local_120 = (undefined1  [8])SVar7.params.id;
      size = wasm::Type::size((Type *)local_120);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                (&local_1c8.operands.
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,size);
      local_c8._8_8_ = 0;
      local_b0 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2466:5)>
                 ::_M_invoke;
      local_b8 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2466:5)>
                 ::_M_manager;
      resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = this;
      local_c8._M_unused._M_object = this;
      makeResumeTable((Result<wasm::ResumeTable> *)local_120,labels,
                      (function<wasm::Result<wasm::Name>_(unsigned_int)> *)
                      ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                      (function<wasm::Result<wasm::Type>_(unsigned_int)> *)&local_c8);
      if (local_b8 != (code *)0x0) {
        (*local_b8)(&local_c8,&local_c8,__destroy_functor);
      }
      handlerTags = local_a0;
      pcVar5 = local_a8;
      __dest = (_Any_data *)
               ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                       super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                       super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                       super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30);
      std::
      _Function_handler<wasm::Result<wasm::Name>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2465:5)>
      ::_M_manager(__dest,__dest,__destroy_functor);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_98,
                      (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_120);
      if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
          super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
          _M_storage[0x28] == '\x01') {
        ct_local.id = (uintptr_t)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&ct_local,local_98,
                   _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                   super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                   (long)local_98);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if ((undefined8 *)ct_local.id == &local_40) {
          *puVar1 = local_40;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
        }
        else {
          *(uintptr_t *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = ct_local.id;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_40;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_98);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_98);
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)local_58;
        ct_local.id = (uintptr_t)this;
        ChildPopper::visitResumeThrow
                  ((Result<wasm::Ok> *)local_98,(ChildPopper *)&ct_local,&local_1c8,ct_00);
        if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
            super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
            _M_storage[0x18] == '\x01') {
          ct_local.id = (uintptr_t)&local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&ct_local,local_98,
                     _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                     super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                     (long)local_98);
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
          anon_unknown_283::validateTypeAnnotation
                    ((Result<wasm::Ok> *)local_98,local_58._M_value.id,local_1c8.cont);
          if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
              _M_storage[0x18] != '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
            handlerBlocks = (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)0x0;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              handlerBlocks = (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_120;
            }
            sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x18;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                          ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x10);
            }
            tag_00.super_IString.str._M_str = pcVar5;
            tag_00.super_IString.str._M_len =
                 _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                 super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                 super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                 super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                 super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
            expr = Builder::makeResumeThrow
                             (&this->builder,tag_00,handlerTags,
                              (vector<wasm::Name,_std::allocator<wasm::Name>_> *)handlerBlocks,
                              sentTypes,&local_1c8.operands,local_1c8.cont);
            push(this,(Expression *)expr);
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
            goto LAB_00c8f192;
          }
          ct_local.id = (uintptr_t)&local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&ct_local,local_98,
                     _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                     super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                     (long)local_98);
        }
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if ((undefined8 *)ct_local.id == &local_40) {
          *puVar1 = local_40;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
        }
        else {
          *(uintptr_t *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = ct_local.id;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_40;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
      }
LAB_00c8f192:
      std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_120);
      return __return_storage_ptr__;
    }
    pcVar6 = "expected continuation type";
    pcVar5 = "";
  }
  else {
    pcVar6 = "the sizes of tags and labels must be equal";
    pcVar5 = "";
  }
  local_1c8.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression._0_8_ =
       &local_1c8.tag;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar6,pcVar5);
  psVar2 = (size_t *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
  *(size_t **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err> = psVar2;
  if ((Name *)local_1c8.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression._0_8_ ==
      &local_1c8.tag) {
    *psVar2 = local_1c8.tag.super_IString.str._M_len;
    *(char **)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
         local_1c8.tag.super_IString.str._M_str;
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
         local_1c8.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression._0_8_;
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
         local_1c8.tag.super_IString.str._M_len;
  }
  *(uintptr_t *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
       local_1c8.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression.type.id;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::makeResumeThrow(HeapType ct,
                           Name tag,
                           const std::vector<Name>& tags,
                           const std::vector<std::optional<Index>>& labels) {
  if (tags.size() != labels.size()) {
    return Err{"the sizes of tags and labels must be equal"};
  }
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }

  ResumeThrow curr(wasm.allocator);
  curr.tag = tag;
  curr.operands.resize(wasm.getTag(tag)->params().size());

  Result<ResumeTable> resumetable = makeResumeTable(
    labels,
    [this](Index i) { return this->getLabelName(i); },
    [this](Index i) { return this->getLabelType(i); });
  CHECK_ERR(resumetable);
  CHECK_ERR(ChildPopper{*this}.visitResumeThrow(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeResumeThrow(tag,
                               tags,
                               resumetable->targets,
                               resumetable->sentTypes,
                               std::move(curr.operands),
                               curr.cont));
  return Ok{};
}